

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O3

void __thiscall qpdf::Tokenizer::inComment(Tokenizer *this,char ch)

{
  state_e sVar1;
  undefined3 in_register_00000031;
  
  if ((CONCAT31(in_register_00000031,ch) == 0xd) || (CONCAT31(in_register_00000031,ch) == 10)) {
    sVar1 = st_before_token;
    if (this->include_ignorable == true) {
      this->type = tt_comment;
      this->in_token = false;
      this->char_to_unread = ch;
      sVar1 = st_token_ready;
    }
    this->state = sVar1;
  }
  return;
}

Assistant:

void
Tokenizer::inComment(char ch)
{
    if ((ch == '\r') || (ch == '\n')) {
        if (include_ignorable) {
            type = tt::tt_comment;
            in_token = false;
            char_to_unread = ch;
            state = st_token_ready;
        } else {
            state = st_before_token;
        }
    }
}